

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O0

void __thiscall chipemu::implementation::nmos::set_node(nmos *this,uint id,bool high)

{
  uint uVar1;
  uint16_t *puVar2;
  uint16_t *node;
  bool high_local;
  uint id_local;
  nmos *this_local;
  
  if ((id != 0) && (uVar1 = node_count(this), id <= uVar1)) {
    node._4_2_ = (uint16_t)id;
    puVar2 = node_addr(this,node._4_2_);
    if (((*puVar2 & 1) == 0) || (high)) {
      if (!high) {
        return;
      }
      if ((*puVar2 & 1) != 0) {
        return;
      }
      *puVar2 = *puVar2 | 1;
      *puVar2 = *puVar2 & 0xfffd;
    }
    else {
      *puVar2 = *puVar2 & 0xfffe;
      *puVar2 = *puVar2 | 2;
    }
    changed_push(this,node._4_2_);
  }
  return;
}

Assistant:

void
nmos::set_node(unsigned id, bool high) noexcept
{
    if (id > 0 and id <= node_count()) {
        uint16_t *node = node_addr(id);

        if ((*node & node_is_pullup) and not high) {
            *node &= ~node_is_pullup;
            *node |= node_is_pulldown;
        }
        else if (high and not (*node & node_is_pullup)) {
            *node |= node_is_pullup;
            *node &= ~node_is_pulldown;
        }
        else return;

        changed_push(id);
    }
}